

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long v1;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  bool bVar6;
  uint uVar7;
  void *pvVar8;
  undefined8 *puVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar10;
  Rep *pRVar11;
  ushort *puVar12;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar13;
  Nonnull<const_char_*> failure_msg;
  string *s;
  ulong uVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s_00;
  uint *puVar15;
  uint uVar16;
  uint64_t extraout_RDX;
  uint64_t uVar17;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ushort *puVar18;
  ushort *puVar19;
  unsigned_long v2;
  uint64_t uVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  uint64_t *puVar22;
  uint uVar23;
  long in_FS_OFFSET;
  pair<const_char_*,_unsigned_int> pVar24;
  string_view wire_bytes;
  string_view str;
  string_view wire_bytes_00;
  LogMessage local_40;
  SerialArena *this_00;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  uVar7 = data.field_0._0_4_;
  if ((uVar7 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_002d7dd2;
  }
  uVar3 = *(ushort *)(table_00.data + 10);
  uVar23 = uVar3 & 0x1c0;
  this_00 = (SerialArena *)(ulong)uVar23;
  puVar19 = (ushort *)0x1;
  uVar20 = hasbits;
  pvVar8 = MaybeGetSplitBase(msg,true,table);
  if (uVar23 != 0x100) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x9b7);
    str._M_str = "Unsupported repeated string rep: ";
    str._M_len = 0x21;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,(unsigned_short)uVar23);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  puVar22 = (uint64_t *)((long)pvVar8 + (ulong)*(uint *)table_00);
  if (((ulong)puVar22 & 7) != 0) {
    AlignFail(puVar22);
  }
  uVar23 = uVar3 & 0x600;
  if ((undefined1 *)*puVar22 == kZeroBuffer) {
    this_00 = (SerialArena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)this_00 & 1) != 0) {
      this_00 = *(SerialArena **)((ulong)this_00 & 0xfffffffffffffffe);
    }
    if (this_00 == (SerialArena *)0x0) {
      puVar9 = (undefined8 *)operator_new(0x18);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9[2] = 0;
    }
    else {
      puVar19 = (ushort *)0x18;
      puVar9 = (undefined8 *)Arena::Allocate((Arena *)this_00,0x18);
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9[2] = this_00;
    }
    *puVar22 = (uint64_t)puVar9;
  }
  this.data = *puVar22;
  s_00.data._4_4_ = 0;
  s_00.data._0_4_ = uVar23;
  if (*(Arena **)(this.data + 0x10) == (Arena *)0x0) {
LAB_002d7f98:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this);
      puVar19 = (ushort *)ptr;
      puVar12 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
      ctx_00 = extraout_RDX_02;
      if (puVar12 == (ushort *)0x0) goto LAB_002d80b8;
      puVar19 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)puVar19;
      s_00.data = table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar23,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_03;
      if (!bVar6) goto LAB_002d80b8;
      puVar19 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = puVar12 < puVar19;
      if (puVar12 < puVar19) {
        bVar1 = (byte)*puVar12;
        this_00 = (SerialArena *)(ulong)bVar1;
        ptr = (char *)((long)puVar12 + 1);
        if ((char)bVar1 < '\0') {
          bVar2 = *ptr;
          s_00.data = (ulong)bVar2 << 7;
          uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          this_00 = (SerialArena *)(ulong)uVar16;
          if ((char)bVar2 < '\0') {
            pVar24 = ReadTagFallback((char *)puVar12,uVar16);
            ptr = pVar24.first;
            this_00 = (SerialArena *)(ulong)pVar24.second;
          }
          else {
            ptr = (char *)(puVar12 + 1);
          }
        }
      }
    } while ((puVar12 < puVar19) && ((uint)this_00 == uVar7));
  }
  else {
    s_00.data = 0xffffffffffffff80;
    uVar17 = *(uint64_t *)(in_FS_OFFSET + -0x78);
    if (uVar17 != ((*(Arena **)(this.data + 0x10))->impl_).tag_and_id_) goto LAB_002d7f98;
    this_00 = *(SerialArena **)(in_FS_OFFSET + -0x70);
    s_00.data = *this.data;
    if ((s_00.data & 1) == 0) {
      pcVar10 = (char *)(ulong)(s_00.data != 0);
    }
    else {
      pRVar11 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this);
      pcVar10 = (char *)(ulong)(uint)pRVar11->allocated_size;
      uVar17 = extraout_RDX;
    }
    pVar24._8_8_ = uVar17;
    pVar24.first = pcVar10;
    aVar21.data = this.data;
    if ((int)pcVar10 != *(int *)(this.data + 8)) goto LAB_002d7f98;
    do {
      bVar1 = (byte)*(ushort *)ptr;
      puVar12 = (ushort *)(ulong)bVar1;
      uVar16 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar24 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback(ptr,(uint)bVar1);
        puVar18 = (ushort *)pVar24.first;
        uVar16 = pVar24.second;
        puVar19 = puVar12;
      }
      else {
        puVar18 = (ushort *)((long)ptr + 1);
      }
      ctx_00 = pVar24._8_8_;
      if (puVar18 == (ushort *)0x0) {
        puVar12 = (ushort *)0x0;
      }
      else {
        _Var4 = (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var4 != 0) {
          v1 = _Var4 - 0x20;
          (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i = v1;
          pSVar5 = (this_00->string_block_)._M_b._M_p;
          v2 = (ulong)pSVar5->allocated_size_ - 0x10;
          if (v2 < v1) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (v1,v2,"offset <= effective_size()");
          }
          else {
            failure_msg = (Nonnull<const_char_*>)0x0;
          }
          if (failure_msg != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                       ,0xa2,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_40);
          }
          aVar21.data = (long)&pSVar5[-1].next_ + _Var4;
        }
        s_00 = aVar21;
        if (_Var4 == 0) {
          s_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 SerialArena::AllocateFromStringBlockFallback(this_00);
        }
        *(uint64_t *)s_00 = s_00.data + 0x10;
        *(undefined8 *)(s_00.data + 8) = 0;
        *(undefined1 *)(s_00.data + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse((RepeatedPtrFieldBase *)this,(void *)s_00);
        puVar12 = (ushort *)
                  EpsCopyInputStream::ReadString
                            (&ctx->super_EpsCopyInputStream,(char *)puVar18,uVar16,(string *)s_00);
        ctx_00 = extraout_RDX_00;
        puVar19 = puVar18;
      }
      if (puVar12 == (ushort *)0x0) {
LAB_002d80b8:
        pcVar10 = Error(msg,(char *)puVar19,ctx_00,(TcFieldData)s_00,table,hasbits);
        return pcVar10;
      }
      pVVar13 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this,*(int *)(this.data + 8) + -1);
      puVar19 = (ushort *)(pVVar13->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)puVar19;
      s_00.data = table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)pVVar13->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar23,(uint16_t)uVar20
                          );
      ctx_00 = extraout_RDX_01;
      if (!bVar6) goto LAB_002d80b8;
      puVar18 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = puVar12 < puVar18;
      if (puVar18 <= puVar12) break;
      bVar1 = (byte)*puVar12;
      pVar24.second._0_1_ = bVar1;
      pVar24.first = (char *)ctx;
      pVar24._9_7_ = 0;
      ptr = (char *)((long)puVar12 + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *ptr;
        s_00.data = (ulong)bVar2 << 7;
        uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        pVar24 = (pair<const_char_*,_unsigned_int>)(ZEXT416(uVar16) << 0x40);
        if ((char)bVar2 < '\0') {
          puVar19 = (ushort *)(ulong)uVar16;
          pVar24 = ReadTagFallback((char *)puVar12,uVar16);
          ptr = pVar24.first;
        }
        else {
          ptr = (char *)(puVar12 + 1);
        }
      }
    } while (pVar24.second == uVar7);
  }
  ptr = (char *)puVar12;
  if ((!bVar6) || ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr)) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar15 & 3) != 0) {
        AlignFail();
      }
      *puVar15 = *puVar15 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar7 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar14 = (ulong)(uVar7 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar14);
LAB_002d7dd2:
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (ABSL_PREDICT_TRUE(arena != nullptr &&
                            arena->impl_.GetSerialArenaFast(&serial_arena) &&
                            field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (ABSL_PREDICT_FALSE(ptr == nullptr ||
                                 !MpVerifyUtf8(field[field.size() - 1], table,
                                               entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (ABSL_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}